

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglRenderCase.cpp
# Opt level: O0

void __thiscall
deqp::egl::SingleContextRenderCase::executeForSurface
          (SingleContextRenderCase *this,EGLDisplay display,EGLSurface surface,Config *config)

{
  uint apiBits_;
  EGLConfig pvVar1;
  uint uVar2;
  deUint32 dVar3;
  deBool dVar4;
  int iVar5;
  Library *egl_00;
  TestLog *this_00;
  MessageBuilder *this_01;
  reference pvVar6;
  undefined4 extraout_var;
  EGLContext pvVar7;
  Config local_258;
  undefined1 local_248 [8];
  UniqueContext context;
  value_type_conflict1 local_ac [10];
  value_type_conflict1 local_84;
  undefined1 local_80 [8];
  vector<int,_std::allocator<int>_> contextAttribs;
  char *apiName;
  EGLint api;
  EGLint apiBit;
  int apiNdx;
  EGLint configApiMask;
  TestLog *log;
  EGLint apis [4];
  Library *egl;
  Config *config_local;
  EGLSurface surface_local;
  EGLDisplay display_local;
  SingleContextRenderCase *this_local;
  
  egl_00 = EglTestContext::getLibrary
                     ((this->super_RenderCase).super_SimpleConfigCase.super_TestCase.m_eglTestCtx);
  apis[0] = 1;
  apis[1] = 2;
  this_00 = tcu::TestContext::getLog
                      ((this->super_RenderCase).super_SimpleConfigCase.super_TestCase.super_TestCase
                       .super_TestNode.m_testCtx);
  uVar2 = eglu::getConfigAttribInt(egl_00,display,config->config,0x3040);
  checkBuildClientAPISupport(*(EGLint *)&(this->super_RenderCase).field_0xbc);
  for (api = 0; api < 4; api = api + 1) {
    apiBits_ = apis[(long)api + -2];
    if (((apiBits_ & *(uint *)&(this->super_RenderCase).field_0xbc) != 0) &&
       ((apiBits_ & uVar2) != 0)) {
      apiName._0_4_ = 0x3038;
      contextAttribs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)local_80);
      if (apiBits_ == 1) {
        apiName._0_4_ = 0x30a0;
        contextAttribs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
        ._M_end_of_storage = (pointer)anon_var_dwarf_c1c697;
        local_ac[2] = 0x3098;
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)local_80,local_ac + 2);
        local_ac[1] = 1;
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)local_80,local_ac + 1);
      }
      else if (apiBits_ == 2) {
        apiName._0_4_ = 0x30a1;
        contextAttribs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
        ._M_end_of_storage = (pointer)0x2b57ca8;
      }
      else if (apiBits_ == 4) {
        apiName._0_4_ = 0x30a0;
        contextAttribs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
        ._M_end_of_storage = (pointer)anon_var_dwarf_c1c677;
        local_84 = 0x3098;
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)local_80,&local_84);
        local_ac[5] = 2;
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)local_80,local_ac + 5);
      }
      else if (apiBits_ == 0x40) {
        apiName._0_4_ = 0x30a0;
        contextAttribs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
        ._M_end_of_storage = (pointer)anon_var_dwarf_c1c68d;
        local_ac[4] = 0x3098;
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)local_80,local_ac + 4);
        local_ac[3] = 3;
        std::vector<int,_std::allocator<int>_>::push_back
                  ((vector<int,_std::allocator<int>_> *)local_80,local_ac + 3);
      }
      local_ac[0] = 0x3038;
      std::vector<int,_std::allocator<int>_>::push_back
                ((vector<int,_std::allocator<int>_> *)local_80,local_ac);
      tcu::TestLog::operator<<
                ((MessageBuilder *)&context.m_context,this_00,
                 (BeginMessageToken *)&tcu::TestLog::Message);
      this_01 = tcu::MessageBuilder::operator<<
                          ((MessageBuilder *)&context.m_context,
                           (char **)&contextAttribs.super__Vector_base<int,_std::allocator<int>_>.
                                     _M_impl.super__Vector_impl_data._M_end_of_storage);
      tcu::MessageBuilder::operator<<(this_01,(EndMessageToken *)&tcu::TestLog::EndMessage);
      tcu::MessageBuilder::~MessageBuilder((MessageBuilder *)&context.m_context);
      do {
        (**egl_00->_vptr_Library)(egl_00,(ulong)(uint)apiName);
        dVar3 = (*egl_00->_vptr_Library[0x1f])();
        eglu::checkError(dVar3,"bindAPI(api)",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRenderCase.cpp"
                         ,0x114);
        dVar4 = ::deGetFalse();
      } while (dVar4 != 0);
      pvVar1 = config->config;
      pvVar6 = std::vector<int,_std::allocator<int>_>::operator[]
                         ((vector<int,_std::allocator<int>_> *)local_80,0);
      iVar5 = (*egl_00->_vptr_Library[6])(egl_00,display,pvVar1,0,pvVar6);
      eglu::UniqueContext::UniqueContext
                ((UniqueContext *)local_248,egl_00,display,(EGLContext)CONCAT44(extraout_var,iVar5))
      ;
      do {
        pvVar7 = eglu::UniqueContext::operator*((UniqueContext *)local_248);
        (*egl_00->_vptr_Library[0x27])(egl_00,display,surface,surface,pvVar7);
        dVar3 = (*egl_00->_vptr_Library[0x1f])();
        eglu::checkError(dVar3,"makeCurrent(display, surface, surface, *context)",
                         "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRenderCase.cpp"
                         ,0x118);
        dVar4 = ::deGetFalse();
      } while (dVar4 != 0);
      pvVar7 = eglu::UniqueContext::operator*((UniqueContext *)local_248);
      RenderCase::Config::Config(&local_258,config->config,config->surfaceTypeBit,apiBits_);
      (*(this->super_RenderCase).super_SimpleConfigCase.super_TestCase.super_TestCase.super_TestNode
        ._vptr_TestNode[7])(this,display,pvVar7,surface,&local_258);
      postSurface(egl_00,display,surface,config->surfaceTypeBit);
      eglu::UniqueContext::~UniqueContext((UniqueContext *)local_248);
      std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)local_80)
      ;
    }
  }
  do {
    (*egl_00->_vptr_Library[0x27])(egl_00,display,0,0);
    dVar3 = (*egl_00->_vptr_Library[0x1f])();
    eglu::checkError(dVar3,"makeCurrent(display, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT)",
                     "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/egl/teglRenderCase.cpp"
                     ,0x11f);
    dVar4 = ::deGetFalse();
  } while (dVar4 != 0);
  return;
}

Assistant:

void SingleContextRenderCase::executeForSurface (EGLDisplay display, EGLSurface surface, const Config& config)
{
	const Library&		egl				= m_eglTestCtx.getLibrary();
	const EGLint		apis[]			= { EGL_OPENGL_ES2_BIT, EGL_OPENGL_ES3_BIT_KHR, EGL_OPENGL_ES_BIT, EGL_OPENVG_BIT };
	tcu::TestLog&		log				= m_testCtx.getLog();
	const EGLint		configApiMask	= eglu::getConfigAttribInt(egl, display, config.config, EGL_RENDERABLE_TYPE);

	checkBuildClientAPISupport(m_apiMask);

	for (int apiNdx = 0; apiNdx < DE_LENGTH_OF_ARRAY(apis); apiNdx++)
	{
		EGLint apiBit = apis[apiNdx];

		// Skip API if build or current config doesn't support it.
		if ((apiBit & m_apiMask) == 0 || (apiBit & configApiMask) == 0)
			continue;

		EGLint			api		= EGL_NONE;
		const char*		apiName	= DE_NULL;
		vector<EGLint>	contextAttribs;

		// Select api enum and build context attributes.
		switch (apiBit)
		{
			case EGL_OPENGL_ES2_BIT:
				api		= EGL_OPENGL_ES_API;
				apiName	= "OpenGL ES 2.x";
				contextAttribs.push_back(EGL_CONTEXT_CLIENT_VERSION);
				contextAttribs.push_back(2);
				break;

			case EGL_OPENGL_ES3_BIT_KHR:
				api		= EGL_OPENGL_ES_API;
				apiName	= "OpenGL ES 3.x";
				contextAttribs.push_back(EGL_CONTEXT_MAJOR_VERSION_KHR);
				contextAttribs.push_back(3);
				break;

			case EGL_OPENGL_ES_BIT:
				api		= EGL_OPENGL_ES_API;
				apiName	= "OpenGL ES 1.x";
				contextAttribs.push_back(EGL_CONTEXT_CLIENT_VERSION);
				contextAttribs.push_back(1);
				break;

			case EGL_OPENVG_BIT:
				api		= EGL_OPENVG_API;
				apiName	= "OpenVG";
				break;

			default:
				DE_ASSERT(DE_FALSE);
		}

		contextAttribs.push_back(EGL_NONE);

		log << TestLog::Message << apiName << TestLog::EndMessage;

		EGLU_CHECK_CALL(egl, bindAPI(api));

		eglu::UniqueContext	context	(egl, display, egl.createContext(display, config.config, EGL_NO_CONTEXT, &contextAttribs[0]));

		EGLU_CHECK_CALL(egl, makeCurrent(display, surface, surface, *context));
		executeForContext(display, *context, surface, Config(config.config, config.surfaceTypeBit, apiBit));

		// Call SwapBuffers() / WaitClient() to finish rendering
		postSurface(egl, display, surface, config.surfaceTypeBit);
	}

	EGLU_CHECK_CALL(egl, makeCurrent(display, EGL_NO_SURFACE, EGL_NO_SURFACE, EGL_NO_CONTEXT));
}